

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_insn_code_t MIR_reverse_branch_code(MIR_insn_code_t code)

{
  MIR_insn_code_t local_c;
  MIR_insn_code_t code_local;
  
  switch(code) {
  case MIR_BT:
    local_c = MIR_BF;
    break;
  case MIR_BTS:
    local_c = MIR_BFS;
    break;
  case MIR_BF:
    local_c = MIR_BT;
    break;
  case MIR_BFS:
    local_c = MIR_BTS;
    break;
  case MIR_BEQ:
    local_c = MIR_BNE;
    break;
  case MIR_BEQS:
    local_c = MIR_BNES;
    break;
  default:
    local_c = MIR_INSN_BOUND;
    break;
  case MIR_BNE:
    local_c = MIR_BEQ;
    break;
  case MIR_BNES:
    local_c = MIR_BEQS;
    break;
  case MIR_BLT:
    local_c = MIR_BGE;
    break;
  case MIR_BLTS:
    local_c = MIR_BGES;
    break;
  case MIR_UBLT:
    local_c = MIR_UBGE;
    break;
  case MIR_UBLTS:
    local_c = MIR_UBGES;
    break;
  case MIR_BLE:
    local_c = MIR_BGT;
    break;
  case MIR_BLES:
    local_c = MIR_BGTS;
    break;
  case MIR_UBLE:
    local_c = MIR_UBGT;
    break;
  case MIR_UBLES:
    local_c = MIR_UBGTS;
    break;
  case MIR_BGT:
    local_c = MIR_BLE;
    break;
  case MIR_BGTS:
    local_c = MIR_BLES;
    break;
  case MIR_UBGT:
    local_c = MIR_UBLE;
    break;
  case MIR_UBGTS:
    local_c = MIR_UBLES;
    break;
  case MIR_BGE:
    local_c = MIR_BLT;
    break;
  case MIR_BGES:
    local_c = MIR_BLTS;
    break;
  case MIR_UBGE:
    local_c = MIR_UBLT;
    break;
  case MIR_UBGES:
    local_c = MIR_UBLTS;
    break;
  case MIR_BO:
    local_c = MIR_BNO;
    break;
  case MIR_UBO:
    local_c = MIR_UBNO;
    break;
  case MIR_BNO:
    local_c = MIR_BO;
    break;
  case MIR_UBNO:
    local_c = MIR_UBO;
    break;
  case MIR_PRBEQ:
    local_c = MIR_PRBNE;
    break;
  case MIR_PRBNE:
    local_c = MIR_PRBEQ;
  }
  return local_c;
}

Assistant:

MIR_insn_code_t MIR_reverse_branch_code (MIR_insn_code_t code) {
  switch (code) {
  case MIR_BT: return MIR_BF;
  case MIR_BTS: return MIR_BFS;
  case MIR_BF: return MIR_BT;
  case MIR_BFS: return MIR_BTS;
  case MIR_BEQ: return MIR_BNE;
  case MIR_BEQS: return MIR_BNES;
  case MIR_BNE: return MIR_BEQ;
  case MIR_BNES: return MIR_BEQS;
  case MIR_BLT: return MIR_BGE;
  case MIR_BLTS: return MIR_BGES;
  case MIR_UBLT: return MIR_UBGE;
  case MIR_UBLTS: return MIR_UBGES;
  case MIR_BLE: return MIR_BGT;
  case MIR_BLES: return MIR_BGTS;
  case MIR_UBLE: return MIR_UBGT;
  case MIR_UBLES: return MIR_UBGTS;
  case MIR_BGT: return MIR_BLE;
  case MIR_BGTS: return MIR_BLES;
  case MIR_UBGT: return MIR_UBLE;
  case MIR_UBGTS: return MIR_UBLES;
  case MIR_BGE: return MIR_BLT;
  case MIR_BGES: return MIR_BLTS;
  case MIR_UBGE: return MIR_UBLT;
  case MIR_UBGES: return MIR_UBLTS;
  case MIR_BO: return MIR_BNO;
  case MIR_UBO: return MIR_UBNO;
  case MIR_BNO: return MIR_BO;
  case MIR_UBNO: return MIR_UBO;
  case MIR_PRBEQ: return MIR_PRBNE;
  case MIR_PRBNE: return MIR_PRBEQ;
  default: return MIR_INSN_BOUND;
  }
}